

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int is_let(JSParseState *s,int decl_mask)

{
  int iVar1;
  BOOL BVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  if ((s->token).val != -0x7d) {
    return 0;
  }
  if ((s->token).u.ident.atom != 0x27) {
    return 0;
  }
  if ((s->token).u.ident.has_escape != 0) {
    return 0;
  }
  iVar5 = s->last_line_num;
  iVar1 = (s->token).line_num;
  puVar3 = (s->token).ptr;
  BVar2 = s->got_lf;
  iVar4 = next_token(s);
  uVar6 = 0xffffffff;
  if (iVar4 != 0) goto LAB_0015c912;
  iVar4 = (s->token).val;
  if (iVar4 < 0x5b) {
    if ((7 < iVar4 + 0x2fU) || ((0xc1U >> (iVar4 + 0x2fU & 0x1f) & 1) == 0)) {
      if (iVar4 != -0x7d) {
LAB_0015c947:
        uVar6 = 0;
        goto LAB_0015c912;
      }
      uVar6 = 0;
      if ((s->token).u.ident.is_reserved != 0) goto LAB_0015c912;
    }
  }
  else {
    if (iVar4 == 0x5b) {
      uVar6 = 1;
      goto LAB_0015c912;
    }
    if (iVar4 != 0x7b) goto LAB_0015c947;
  }
  uVar6 = (uint)(byte)((byte)((decl_mask & 4U) >> 2) | s->last_line_num == (s->token).line_num);
LAB_0015c912:
  (s->token).line_num = iVar5;
  s->line_num = iVar1;
  s->buf_ptr = puVar3;
  s->got_lf = BVar2;
  iVar5 = next_token(s);
  return -(uint)(iVar5 != 0) | uVar6;
}

Assistant:

static int is_let(JSParseState *s, int decl_mask)
{
    int res = FALSE;

    if (token_is_pseudo_keyword(s, JS_ATOM_let)) {
#if 1
        JSParsePos pos;
        js_parse_get_pos(s, &pos);
        for (;;) {
            if (next_token(s)) {
                res = -1;
                break;
            }
            if (s->token.val == '[') {
                /* let [ is a syntax restriction:
                   it never introduces an ExpressionStatement */
                res = TRUE;
                break;
            }
            if (s->token.val == '{' ||
                (s->token.val == TOK_IDENT && !s->token.u.ident.is_reserved) ||
                s->token.val == TOK_LET ||
                s->token.val == TOK_YIELD ||
                s->token.val == TOK_AWAIT) {
                /* Check for possible ASI if not scanning for Declaration */
                /* XXX: should also check that `{` introduces a BindingPattern,
                   but Firefox does not and rejects eval("let=1;let\n{if(1)2;}") */
                if (s->last_line_num == s->token.line_num || (decl_mask & DECL_MASK_OTHER)) {
                    res = TRUE;
                    break;
                }
                break;
            }
            break;
        }
        if (js_parse_seek_token(s, &pos)) {
            res = -1;
        }
#else
        int tok = peek_token(s, TRUE);
        if (tok == '{' || tok == TOK_IDENT || peek_token(s, FALSE) == '[') {
            res = TRUE;
        }
#endif
    }
    return res;
}